

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O3

bool __thiscall ShParser::parseParameters(ShParser *this,Parser *parser,tShOpcode *opcode)

{
  byte *pbVar1;
  byte bVar2;
  pointer __n;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  Token *pTVar8;
  size_t __n_00;
  _Alloc_hider _Var9;
  byte *__s2;
  ShParser *pSVar10;
  char **ppcVar11;
  char *encoding;
  allocator<char> local_81;
  byte *local_80;
  _Alloc_hider local_78;
  ShParser *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Expression *local_58;
  ShParser *local_50;
  _Alloc_hider local_48;
  size_type local_40;
  
  __s2 = (byte *)opcode->encoding;
  (this->immediate).primary.type = None;
  local_80 = __s2;
  local_78._M_p = (pointer)this;
  local_68._M_allocated_capacity = (size_type)opcode;
  if (*__s2 != 0) {
    local_68._8_8_ = &this->immediate;
    local_70 = (ShParser *)&(this->registers).grt;
    local_58 = &(this->immediate).primary.expression;
    do {
      if ((*(byte *)(local_68._M_allocated_capacity + 0x1c) & 8) != 0) {
        pTVar8 = Tokenizer::peekToken
                           ((parser->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
        ppcVar11 = shSpecialForcedRegisters;
        pSVar10 = (ShParser *)0x19029b;
        do {
          ppcVar11 = ppcVar11 + 1;
          __n_00 = strlen((char *)pSVar10);
          this = pSVar10;
          iVar7 = bcmp(pSVar10,__s2,__n_00);
          if (iVar7 == 0) {
            if (pTVar8->type == Identifier) {
              if (*(__index_type *)
                   ((long)&(pTVar8->value).
                           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   + 0x20) != '\x04') goto LAB_0016f130;
              this = (ShParser *)&local_50;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)this,(char *)pSVar10,&local_81);
              pSVar10 = local_50;
              __n = *(pointer *)
                     ((long)&(pTVar8->value).
                             super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     + 8);
              if (__n == local_48._M_p) {
                if (__n == (pointer)0x0) {
                  bVar6 = true;
                }
                else {
                  this = *(ShParser **)
                          &(pTVar8->value).
                           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           ._M_u;
                  iVar7 = bcmp(this,local_50,(size_t)__n);
                  bVar6 = iVar7 == 0;
                }
              }
              else {
                bVar6 = false;
              }
              if (pSVar10 != (ShParser *)&stack0xffffffffffffffc0) {
                operator_delete(pSVar10,local_40 + 1);
                this = pSVar10;
              }
              if (bVar6) {
                this = (ShParser *)
                       (parser->entries).
                       super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
                local_80 = __s2 + __n_00;
                Tokenizer::eatTokens((Tokenizer *)this,1);
                __s2 = __s2 + __n_00;
                goto LAB_0016f0d8;
              }
            }
            break;
          }
          pSVar10 = (ShParser *)*ppcVar11;
        } while (pSVar10 != (ShParser *)0x0);
      }
      pbVar1 = __s2 + 1;
      bVar2 = *__s2;
      local_80 = pbVar1;
      if (bVar2 < 0x73) {
        if (bVar2 == 0x40) {
          pTVar8 = Tokenizer::peekToken
                             ((parser->entries).
                              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
          if (pTVar8->type != Identifier) {
            return false;
          }
          this = (ShParser *)
                 (parser->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer;
          pTVar8 = Tokenizer::peekToken((Tokenizer *)this,0);
          if (*(__index_type *)
               ((long)&(pTVar8->value).
                       super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                       super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
               + 0x20) != '\x04') {
LAB_0016f130:
            __assert_fail("std::holds_alternative<Identifier>(value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                          ,0x4d,"const Identifier &Token::identifierValue() const");
          }
          if (**(char **)&(pTVar8->value).
                          super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          ._M_u != '@') {
            return false;
          }
          bVar2 = *pbVar1;
          if (bVar2 < 0x73) {
            if ((bVar2 != 0x28) && (bVar2 != 0x2d)) {
              return false;
            }
            this = (ShParser *)
                   (parser->entries).
                   super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1].tokenizer;
            Tokenizer::eatTokens((Tokenizer *)this,1);
            bVar6 = matchSymbol(this,parser,*pbVar1);
          }
          else {
            _Var9._M_p = local_78._M_p;
            if ((bVar2 != 0x73) && (_Var9._M_p = (pointer)local_70, bVar2 != 0x74)) {
              return false;
            }
            (((ShParser *)_Var9._M_p)->registers).grs.type = Normal;
            bVar6 = parseRegisterTable(this,parser,(ShRegisterValue *)_Var9._M_p,shRegisters,0x20);
          }
          if (bVar6 == false) {
            return false;
          }
          local_80 = __s2 + 2;
          __s2 = local_80;
        }
        else {
          if (bVar2 != 0x69) goto LAB_0016efe2;
          bVar6 = parseImmediate(this,parser,local_58);
          if (!bVar6) {
            return false;
          }
          this = (ShParser *)&local_80;
          bVar6 = decodeImmediateSize((char **)this,(ShImmediateType *)local_68._8_8_);
          __s2 = local_80;
          if (!bVar6) {
            return false;
          }
        }
      }
      else {
        _Var9._M_p = local_78._M_p;
        if ((bVar2 == 0x73) || (_Var9._M_p = (pointer)local_70, bVar2 == 0x74)) {
          (((ShParser *)_Var9._M_p)->registers).grs.type = Normal;
          bVar6 = parseRegisterTable(this,parser,(ShRegisterValue *)_Var9._M_p,shRegisters,0x20);
        }
        else {
LAB_0016efe2:
          bVar6 = matchSymbol(this,parser,bVar2);
        }
        __s2 = pbVar1;
        if (bVar6 == false) {
          return false;
        }
      }
LAB_0016f0d8:
    } while (*__s2 != 0);
  }
  pcVar3 = *(char **)local_68._M_allocated_capacity;
  pcVar4 = *(char **)(local_68._M_allocated_capacity + 8);
  sVar5 = *(size_type *)(local_68._M_allocated_capacity + 0x18);
  (((Identifier *)(local_78._M_p + 0x98))->_name)._M_dataplus._M_p =
       *(pointer *)(local_68._M_allocated_capacity + 0x10);
  *(size_type *)(local_78._M_p + 0xa0) = sVar5;
  (((ShOpcodeData *)(local_78._M_p + 0x88))->opcode).name = pcVar3;
  *(char **)(local_78._M_p + 0x90) = pcVar4;
  pTVar8 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  return pTVar8->type == Separator;
}

Assistant:

bool ShParser::parseParameters(Parser& parser, const tShOpcode& opcode)
{
	const char* encoding = opcode.encoding;

	// initialize opcode variables
	immediate.primary.type = ShImmediateType::None;

	while (*encoding != 0)
	{
		// Some registers in instructions are forced
		// and do not have a numerical representation (except for r0.)
		// This handles said forced registers.
		if (opcode.flags & SH_FREG)
		{
			const char **fReg = shSpecialForcedRegisters;
			const Token &token = parser.peekToken();
			bool skip = false;
			while (*fReg)
			{
				size_t length = strlen(*fReg);
				if (memcmp(*fReg, encoding, length) == 0)
				{
					if (token.type != TokenType::Identifier)
						break;

					const auto &identifier = token.identifierValue();
					if (identifier.string() == std::string(*fReg))
					{
						skip = true;
						encoding += length;
						parser.eatToken();
						break;
					}
					break;
				}
				fReg += 1;
			}
			if (skip)
				continue;
		}

		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			CHECK(decodeImmediateSize(encoding,immediate.primary.type));
			break;
		case '@':
			// '@' is not a separate token, and at the same time it's
			// part of the SuperH instruction parameter scheme,
			// so I came up with this rather ugly solution to handle it. 
			if (parser.peekToken().type != TokenType::Identifier)
				return false;
			if (parser.peekToken().identifierValue().string()[0] != '@')
				return false;
			if (*encoding == 't')
			{
				CHECK(parseRegister(parser,registers.grt));
			}
			else if (*encoding == 's')
			{
				CHECK(parseRegister(parser,registers.grs));
			}
			else if (*encoding == '(' || *encoding == '-') // "mov.* r0,@(i4,t)", "mov.* s,@-t" and the others
			{
				parser.eatToken();
				CHECK(matchSymbol(parser, *encoding));
			}
			else
			{
				return false;
			}
			encoding++;
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	opcodeData.opcode = opcode;

	// the next token has to be a separator, else the parameters aren't
	// completely parsed

	return parser.nextToken().type == TokenType::Separator;

}